

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O2

void __thiscall LinePrinter::PrintOnNewLine(LinePrinter *this,string *to_print)

{
  bool bVar1;
  
  if ((this->console_locked_ == true) && ((this->line_buffer_)._M_string_length != 0)) {
    std::__cxx11::string::append((string *)&this->output_buffer_);
    std::__cxx11::string::append((ulong)&this->output_buffer_,'\x01');
    (this->line_buffer_)._M_string_length = 0;
    *(this->line_buffer_)._M_dataplus._M_p = '\0';
  }
  if (this->have_blank_line_ == false) {
    PrintOrBuffer(this,"\n",1);
  }
  bVar1 = true;
  if (to_print->_M_string_length != 0) {
    PrintOrBuffer(this,(to_print->_M_dataplus)._M_p,to_print->_M_string_length);
    if (to_print->_M_string_length != 0) {
      bVar1 = (to_print->_M_dataplus)._M_p[to_print->_M_string_length - 1] == '\n';
    }
  }
  this->have_blank_line_ = bVar1;
  return;
}

Assistant:

void LinePrinter::PrintOnNewLine(const string& to_print) {
  if (console_locked_ && !line_buffer_.empty()) {
    output_buffer_.append(line_buffer_);
    output_buffer_.append(1, '\n');
    line_buffer_.clear();
  }
  if (!have_blank_line_) {
    PrintOrBuffer("\n", 1);
  }
  if (!to_print.empty()) {
    PrintOrBuffer(&to_print[0], to_print.size());
  }
  have_blank_line_ = to_print.empty() || *to_print.rbegin() == '\n';
}